

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphStatistics.cpp
# Opt level: O3

void __thiscall
floorplan::GraphStatistics::saveDistToFile
          (GraphStatistics *this,string *filename,DistVectorByLabel *dist)

{
  bool bVar1;
  char cVar2;
  ostream *poVar3;
  _Base_ptr p_Var4;
  _Rb_tree_node_base *p_Var5;
  ulong uVar6;
  ulong uVar7;
  ofstream out;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream((ostream *)&local_230,(filename->_M_dataplus)._M_p,_S_out);
  for (p_Var5 = (dist->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &(dist->_M_t)._M_impl.super__Rb_tree_header;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,*(char **)(p_Var5 + 1),(long)p_Var5[1]._M_parent);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    p_Var4 = *(_Base_ptr *)(p_Var5 + 2);
    if (p_Var5[2]._M_parent != p_Var4) {
      uVar6 = 0;
      uVar7 = 1;
      do {
        poVar3 = std::ostream::_M_insert<double>(*(double *)(&p_Var4->_M_color + uVar6 * 2));
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
        p_Var4 = *(_Base_ptr *)(p_Var5 + 2);
        bVar1 = uVar7 < (ulong)((long)p_Var5[2]._M_parent - (long)p_Var4 >> 3);
        uVar6 = uVar7;
        uVar7 = (ulong)((int)uVar7 + 1);
      } while (bVar1);
    }
    cVar2 = (char)(ostream *)&local_230;
    std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
  }
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void GraphStatistics::saveDistToFile(string filename, DistVectorByLabel dist){
    std::ofstream out(filename.c_str() );
    DistVectorByLabel::iterator it = dist.begin();

    for (; it != dist.end(); ++it){
        out << it->first << ", ";
        for (unsigned int i = 0; i < it->second.size(); i++){
            out << it->second[i] << " ";
        }
        out << endl;
    }
    out.close();
}